

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_string.c
# Opt level: O3

char * mk_string_dup(char *s)

{
  size_t __n;
  char *__dest;
  
  if (s != (char *)0x0) {
    __n = strlen(s);
    __dest = (char *)malloc(__n + 1);
    if (__dest == (char *)0x0 && __n + 1 != 0) {
      perror("malloc");
    }
    else if (__dest != (char *)0x0) {
      memcpy(__dest,s,__n);
      __dest[__n] = '\0';
      return __dest;
    }
  }
  return (char *)0x0;
}

Assistant:

char *mk_string_dup(const char *s)
{
    size_t len;
    char *p;

    if (!s) {
        return NULL;
    }

    len = strlen(s);
    p = mk_mem_alloc(len + 1);
    if (!p) {
        return NULL;
    }
    memcpy(p, s, len);
    p[len] = '\0';

    return p;
}